

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O2

void test_ADynArray_remove_indexBeyoundBounds_fn(int _i)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  code *local_38;
  code *pcStack_30;
  code *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  
  local_38 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_30 = private_ACUtilsTest_ADynArray_free;
  local_20 = (char *)0xb;
  local_28 = private_ACUtilsTest_ADynArray_growStrategy;
  local_18 = (char *)0x10;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  local_10 = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,0x10);
  builtin_strncpy(local_10,"0123456789",0xb);
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  private_ACUtils_ADynArray_remove(&local_38,0xd,5,1);
  if (local_20 == (char *)0xb) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x239);
    if (local_18 == (char *)0x10) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x23a);
      if (local_10 == (char *)0x0) {
        pcVar2 = (char *)0x0;
        pcVar6 = (char *)0x0;
        expr = "Assertion \'_ck_x != NULL\' failed";
        pcVar3 = "Assertion \'%s\' failed: %s == %#x";
        pcVar4 = "(void*) array.buffer != NULL";
        pcVar5 = "(void*) array.buffer";
        iVar1 = 0x23b;
      }
      else {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x23b);
        pcVar6 = local_10;
        if (local_10 == (char *)0x0) {
          pcVar2 = "";
          pcVar6 = "(null)";
        }
        else {
          iVar1 = strcmp("0123456789",local_10);
          if (iVar1 == 0) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x23c);
            if (local_28 == (code *)0x0) {
              pcVar2 = (char *)0x0;
              pcVar6 = (char *)0x0;
              expr = "Assertion \'_ck_x != NULL\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %#x";
              pcVar4 = "(void*) array.growStrategy != NULL";
              pcVar5 = "(void*) array.growStrategy";
              iVar1 = 0x23d;
            }
            else {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x23d);
              if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x23e);
                (*pcStack_30)(local_10);
                return;
              }
              pcVar6 = "0";
              expr = "Assertion \'_ck_x == _ck_y\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
              pcVar4 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
              pcVar5 = "private_ACUtilsTest_ADynArray_reallocCount";
              iVar1 = 0x23e;
              pcVar2 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
            }
            goto LAB_0010e1e3;
          }
          pcVar2 = "\"";
        }
        expr = 
        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
        ;
        pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
        pcVar4 = "array.buffer == \"0123456789\"";
        pcVar5 = "array.buffer";
        iVar1 = 0x23c;
      }
    }
    else {
      pcVar6 = "16";
      expr = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar4 = "array.capacity == 16";
      pcVar5 = "array.capacity";
      iVar1 = 0x23a;
      pcVar2 = local_18;
    }
  }
  else {
    pcVar6 = "11";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar4 = "array.size == 11";
    pcVar5 = "array.size";
    iVar1 = 0x239;
    pcVar2 = local_20;
  }
LAB_0010e1e3:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar1,expr,pcVar3,pcVar4,pcVar5,pcVar2,pcVar6);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_remove_indexBeyoundBounds)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 11;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = 16;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    memcpy(array.buffer, "0123456789", 11);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ADynArray_remove(&array, 13, 5);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 11);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 16);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "0123456789");
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    array.deallocator(array.buffer);
}